

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

logical pnga_create_bin_range(Integer g_bin,Integer g_cnt,Integer g_off,Integer *g_range)

{
  long lVar1;
  long lVar2;
  Integer IVar3;
  Integer IVar4;
  logical lVar5;
  ulong uVar6;
  undefined4 *buf;
  ulong uVar7;
  ulong local_120;
  undefined4 local_118;
  undefined4 uStack_114;
  undefined4 uStack_110;
  undefined4 uStack_10c;
  Integer hi;
  Integer lo;
  Integer hibin;
  Integer *local_e8;
  Integer *myoff;
  long local_d8;
  Integer lobin;
  Integer local_c8;
  Integer local_c0;
  Integer local_b8;
  Integer last_proc;
  Integer first_proc;
  Integer type;
  Integer thi [2];
  Integer tlo [2];
  Integer crap;
  Integer nbin;
  Integer ndim;
  Integer chunk [2];
  Integer dims [2];
  
  local_e8 = g_range;
  local_c0 = g_cnt;
  IVar3 = pnga_nodeid();
  IVar4 = pnga_nnodes();
  pnga_inquire(g_bin,&type,&ndim,&nbin);
  if (ndim != 1) {
    pnga_error("ga_bin_index: 1-dim array required",ndim);
  }
  if ((0xf < type - 0x3e9U) || ((0x8003UL >> (type - 0x3e9U & 0x3f) & 1) == 0)) {
    pnga_error("ga_bin_index: not integer type",type);
  }
  dims[0] = 2;
  chunk[0] = 2;
  chunk[1] = 1;
  dims[1] = IVar4;
  lVar5 = pnga_create(0x3f2,2,dims,"bin_proc",chunk,local_e8);
  if (lVar5 == 0) {
    lVar5 = 0;
  }
  else {
    pnga_distribution(g_off,IVar3,&lobin,&hibin);
    if (0 < lobin) {
      pnga_access_ptr(g_off,&lobin,&hibin,&myoff,&crap);
      local_b8 = *myoff + 1;
      local_d8 = myoff[hibin - lobin] + 1;
      lVar5 = pnga_locate(g_bin,&local_b8,&first_proc);
      if (lVar5 == 0) {
        pnga_error("ga_bin_sorter: failed to locate region f",local_b8);
      }
      local_c8 = g_bin;
      lVar5 = pnga_locate(g_bin,&local_d8,&last_proc);
      if (lVar5 == 0) {
        pnga_error("ga_bin_sorter: failed to locate region l",local_d8);
      }
      IVar3 = first_proc;
      while (IVar3 <= last_proc) {
        local_118 = 0xffffffff;
        uStack_114 = 0xffffffff;
        uStack_110 = 0xffffffff;
        uStack_10c = 0xffffffff;
        pnga_distribution(local_c8,IVar3,&lo,&hi);
        if (lobin <= hibin) {
          lVar2 = *myoff;
          lVar1 = lVar2 + 1;
          if (lobin == hibin) {
            pnga_get(local_c0,&hibin,&hibin,&local_120,&hibin);
            uVar6 = (ulong)(lVar1 == lo);
            uVar7 = uVar6 + 2;
            if (lVar2 + local_120 != hi) {
              uVar7 = uVar6;
            }
            lVar5 = (*(code *)(&DAT_001ae3f0 + *(int *)(&DAT_001ae3f0 + uVar7 * 4)))();
            return lVar5;
          }
          uVar6 = (ulong)(lVar1 == lo);
          uVar7 = uVar6 + 2;
          if (myoff[1] != hi) {
            uVar7 = uVar6;
          }
          lVar5 = (*(code *)(&DAT_001ae3f0 + *(int *)(&DAT_001ae3f0 + uVar7 * 4)))();
          return lVar5;
        }
        lVar1 = CONCAT44(uStack_114,local_118);
        local_120 = (ulong)(lVar1 != -1);
        if (CONCAT44(uStack_10c,uStack_110) == -1) {
          uVar7 = 1;
          if (lVar1 != -1) goto LAB_0013ab43;
          IVar3 = IVar3 + 1;
        }
        else {
          uVar7 = (ulong)(lVar1 != -1) + 1;
          local_120 = uVar7;
LAB_0013ab43:
          IVar3 = IVar3 + 1;
          buf = &uStack_110;
          if (lVar1 != -1) {
            buf = &local_118;
          }
          lo = (ulong)(lVar1 == -1) + 1;
          hi = (lVar1 == -1) + uVar7;
          thi[0] = hi;
          thi[1] = IVar3;
          tlo[0] = lo;
          tlo[1] = IVar3;
          pnga_put(*local_e8,tlo,thi,buf,(Integer *)&local_120);
        }
      }
    }
    lVar5 = 1;
  }
  return lVar5;
}

Assistant:

logical pnga_create_bin_range(Integer g_bin, Integer g_cnt, Integer g_off, Integer *g_range)
{
Integer type, ndim, nbin, lobin, hibin, me=pnga_nodeid(),crap;
Integer dims[2], nproc=pnga_nnodes(),chunk[2];
Integer tlo[2], thi[2];

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    chunk[0]=dims[0]=2; dims[1]=nproc; chunk[1]=1;
    if(!pnga_create(MT_F_INT, 2, dims, "bin_proc",chunk,g_range)) return FALSE;

    pnga_distribution(g_off,me, &lobin,&hibin);

    if(lobin>0){ /* enter this block when we have data */
      Integer first_proc, last_proc, p;
      Integer first_off, last_off;
      Integer *myoff, bin;

      /* get offset values stored on my processor to first and last bin */
      pnga_access_ptr(g_off, &lobin, &hibin, &myoff, &crap);
      first_off = myoff[0]; last_off = myoff[hibin-lobin];
/*
      pnga_get(g_off,&lobin,&lobin,&first_off,&lo);
      pnga_get(g_off,&hibin,&hibin,&last_off,&hi);
*/

      /* since offset starts at 0, add 1 to get index to g_bin */
      first_off++; last_off++;

      /* find processors on which these bins are located */
      if(!pnga_locate(g_bin, &first_off, &first_proc))
          pnga_error("ga_bin_sorter: failed to locate region f",first_off);
      if(!pnga_locate(g_bin, &last_off, &last_proc))
          pnga_error("ga_bin_sorter: failed to locate region l",last_off);

      /* inspect range of indices to bin elements stored on these processors */
      for(p=first_proc, bin=lobin; p<= last_proc; p++){
          Integer lo, hi, buf[2], off, cnt; 
          buf[0] =-1; buf[1]=-1;

          pnga_distribution(g_bin,p,&lo,&hi);

          for(/* start from current bin */; bin<= hibin; bin++, myoff++){ 
              Integer blo,bhi,stat;

              blo = *myoff +1;
              if(bin == hibin){
                 pnga_get(g_cnt, &hibin, &hibin, &cnt, &hibin); /* local */
                 bhi = blo + cnt-1; 
              }else
                 bhi = myoff[1]; 

              stat= sgai_match_bin2proc(blo, bhi, lo, hi);

              switch (stat) {
              case 0:  /* bin in a middle */ break;
              case 1:  /* first bin on that processor */
                       buf[0] =bin; break;
              case 2:  /* last bin on that processor */
                       buf[1] =bin; break;
              case 3:  /* first and last bin on that processor */
                       buf[0] =bin; buf[1] =bin; break;
              }

              if(stat>1)break; /* found last bin on that processor */
          }
          
          /* set range of bins on processor p */
          cnt =0; off=1;
          if(buf[0]!=-1){cnt=1; off=0;} 
          if(buf[1]!=-1)cnt++; 
          if(cnt){
                 Integer p1 = p+1;
                 lo = 1+off; hi = lo+cnt-1;
                 tlo[0] = lo;
                 tlo[1] = p1;
                 thi[0] = hi;
                 thi[1] = p1;
                 pnga_put(*g_range, tlo, thi, buf+off, &cnt);
          }
      }
   }
   return TRUE;
}